

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pCVar2;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  pointer this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  CompileCommandParser parser;
  ifstream file;
  string local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  CompileCommandParser local_2b0;
  ifstream local_238 [520];
  
  std::ifstream::ifstream(local_238,"compile_commands.json",_S_in);
  local_2b0.Command.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b0.Command.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header;
  local_2b0.TranslationUnits.
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b0.TranslationUnits.
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_start = (CommandType *)0x0;
  local_2b0.TranslationUnits.
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (CommandType *)0x0;
  local_2b0.Command.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b0.Command.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b0.Command.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b0.String._M_dataplus._M_p = (pointer)&local_2b0.String.field_2;
  local_2b0.String._M_string_length = 0;
  local_2b0.String.field_2._M_local_buf[0] = '\0';
  local_2b0.Command.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b0.Command.
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b0.Input = local_238;
  CompileCommandParser::Parse(&local_2b0);
  pCVar2 = local_2b0.TranslationUnits.
           super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_2b0.TranslationUnits.
      super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2b0.TranslationUnits.
      super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_2e8.field_2;
    this = local_2b0.TranslationUnits.
           super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"command","");
      psVar4 = CompileCommandParser::CommandType::at(this,&local_2e8);
      cmSystemTools::ParseUnixCommandLine((psVar4->_M_dataplus)._M_p,&local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      local_2e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"directory","");
      psVar4 = CompileCommandParser::CommandType::at(this,&local_2e8);
      bVar3 = cmSystemTools::RunSingleCommand
                        (&local_2c8,(string *)0x0,(string *)0x0,(int *)0x0,
                         (psVar4->_M_dataplus)._M_p,OUTPUT_MERGE,0.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ERROR: Failed to run command \"",0x1e);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            ((local_2c8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                            (local_2c8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
        std::endl<char,std::char_traits<char>>(poVar5);
        exit(1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2c8);
      this = this + 1;
    } while (this != pCVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0.String._M_dataplus._M_p != &local_2b0.String.field_2) {
    operator_delete(local_2b0.String._M_dataplus._M_p,
                    CONCAT71(local_2b0.String.field_2._M_allocated_capacity._1_7_,
                             local_2b0.String.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_2b0.Command);
  std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ::~vector(&local_2b0.TranslationUnits);
  std::ifstream::~ifstream(local_238);
  return 0;
}

Assistant:

int main ()
{
  std::ifstream file("compile_commands.json");
  CompileCommandParser parser(&file);
  parser.Parse();
  for(CompileCommandParser::TranslationUnitsType::const_iterator
      it = parser.GetTranslationUnits().begin(),
      end = parser.GetTranslationUnits().end(); it != end; ++it)
    {
    std::vector<std::string> command;
    cmSystemTools::ParseUnixCommandLine(it->at("command").c_str(), command);
    if (!cmSystemTools::RunSingleCommand(
            command, 0, 0, 0, it->at("directory").c_str()))
      {
      std::cout << "ERROR: Failed to run command \""
                << command[0] << "\"" << std::endl;
      exit(1);
      }
    }
  return 0;
}